

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_math.c
# Opt level: O0

void random_init(RandomState *rs,double d)

{
  uint uVar1;
  RandomState *in_RDI;
  double in_XMM0_Qa;
  uint32_t m;
  U64double u;
  int i;
  uint32_t r;
  double local_20;
  int local_18;
  uint local_14;
  double local_10;
  
  local_14 = 0x11090601;
  local_10 = in_XMM0_Qa;
  for (local_18 = 0; local_18 < 4; local_18 = local_18 + 1) {
    uVar1 = 1 << (sbyte)local_14;
    local_14 = local_14 >> 8;
    local_10 = local_10 * 3.141592653589793 + 2.718281828459045;
    local_20 = local_10;
    if ((ulong)local_10 < (ulong)uVar1) {
      local_20 = (double)((ulong)uVar1 + (long)local_10);
    }
    in_RDI->gen[local_18] = (uint64_t)local_20;
  }
  in_RDI->valid = 1;
  for (local_18 = 0; local_18 < 10; local_18 = local_18 + 1) {
    lj_math_random_step(in_RDI);
  }
  return;
}

Assistant:

static void random_init(RandomState *rs, double d)
{
  uint32_t r = 0x11090601;  /* 64-k[i] as four 8 bit constants. */
  int i;
  for (i = 0; i < 4; i++) {
    U64double u;
    uint32_t m = 1u << (r&255);
    r >>= 8;
    u.d = d = d * 3.14159265358979323846 + 2.7182818284590452354;
    if (u.u64 < m) u.u64 += m;  /* Ensure k[i] MSB of gen[i] are non-zero. */
    rs->gen[i] = u.u64;
  }
  rs->valid = 1;
  for (i = 0; i < 10; i++)
    lj_math_random_step(rs);
}